

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O0

void __thiscall Kernel::InferenceStore::TPTPProofPrinter::printStep(TPTPProofPrinter *this,Unit *us)

{
  bool bVar1;
  Inference *this_00;
  ostream *poVar2;
  Unit *in_RSI;
  long in_RDI;
  Unit *prem;
  bool first;
  Unit *in_stack_00000178;
  TPTPProofPrinter *in_stack_00000180;
  string statusStr;
  string newSymbOrigin;
  string newSymbolInfo;
  string axiomName;
  string fileName;
  string inferenceStr;
  string formulaStr;
  UnitIterator parents;
  InferenceRule rule;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  Unit *in_stack_fffffffffffffaa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa8;
  undefined7 in_stack_fffffffffffffac8;
  undefined1 in_stack_fffffffffffffacf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad0;
  string *this_01;
  Unit *in_stack_fffffffffffffad8;
  char *__s;
  undefined6 in_stack_fffffffffffffae0;
  undefined1 in_stack_fffffffffffffae6;
  InferenceRule in_stack_fffffffffffffae7;
  TPTPProofPrinter *in_stack_fffffffffffffae8;
  string local_4e8 [8];
  string *in_stack_fffffffffffffb20;
  TPTPProofPrinter *in_stack_fffffffffffffb28;
  string local_4c8 [32];
  string local_4a8 [16];
  Unit *in_stack_fffffffffffffb68;
  string *in_stack_fffffffffffffb70;
  TPTPProofPrinter *in_stack_fffffffffffffb78;
  Unit *in_stack_fffffffffffffb80;
  TPTPProofPrinter *in_stack_fffffffffffffb88;
  string local_468 [32];
  Unit *local_448;
  byte local_439;
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  Unit *in_stack_fffffffffffffc48;
  TPTPProofPrinter *in_stack_fffffffffffffc50;
  string local_390 [31];
  InferenceRule in_stack_fffffffffffffc8f;
  string *in_stack_fffffffffffffc90;
  string *in_stack_fffffffffffffc98;
  string *in_stack_fffffffffffffca0;
  TPTPProofPrinter *in_stack_fffffffffffffca8;
  string local_350 [16];
  UnitInputType in_stack_fffffffffffffcc0;
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  undefined4 local_30;
  InferenceRule local_11;
  Unit *local_10;
  
  local_10 = in_RSI;
  this_00 = Unit::inference(in_RSI);
  local_11 = Inference::rule(this_00);
  Unit::getParents((Unit *)CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8));
  if (local_11 == GENERAL_SPLITTING) {
    printSplitting(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    local_30 = 1;
    goto LAB_0086e5a4;
  }
  if (local_11 == GENERAL_SPLITTING_COMPONENT) {
    printGeneralSplittingComponent(in_stack_00000180,in_stack_00000178);
    local_30 = 1;
    goto LAB_0086e5a4;
  }
  getFormulaString_abi_cxx11_(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  std::__cxx11::string::string(local_70);
  if (local_11 == INPUT) {
    std::__cxx11::string::string(local_90);
    Shell::Options::inputFile_abi_cxx11_
              ((Options *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffaa0,
                            (char *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    std::__cxx11::string::~string(local_b0);
    if (bVar1) {
      std::__cxx11::string::operator=(local_90,"unknown");
    }
    else {
      Shell::Options::inputFile_abi_cxx11_
                ((Options *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
      std::operator+((char *)in_stack_fffffffffffffaa8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffaa0);
      std::operator+(in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
      std::__cxx11::string::operator=(local_90,local_d0);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::~string(local_110);
    }
    std::__cxx11::string::string(local_130);
    if (((*(byte *)(in_RDI + 0x80) & 1) == 0) ||
       (bVar1 = Parse::TPTP::findAxiomName
                          (in_stack_fffffffffffffaa0,
                           (string *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98)),
       !bVar1)) {
      bVar1 = Unit::isClause(local_10);
      if (!bVar1) {
        Unit::getFormula((Unit *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        bVar1 = Formula::hasLabel((Formula *)0x86dad6);
        if (bVar1) {
          in_stack_fffffffffffffae8 =
               (TPTPProofPrinter *)
               Unit::getFormula((Unit *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98
                                                ));
          Formula::getLabel_abi_cxx11_
                    ((Formula *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
          std::__cxx11::string::operator=(local_130,local_150);
          std::__cxx11::string::~string(local_150);
          goto LAB_0086db65;
        }
      }
      std::__cxx11::string::operator=(local_130,"unknown");
    }
LAB_0086db65:
    std::operator+((char *)in_stack_fffffffffffffae8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffae7,
                            CONCAT16(in_stack_fffffffffffffae6,in_stack_fffffffffffffae0)));
    std::operator+(in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
    std::__cxx11::string::string(local_210,local_130);
    quoteAxiomName(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
    std::operator+(in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
    std::__cxx11::string::operator=(local_70,local_170);
    std::__cxx11::string::~string(local_170);
    std::__cxx11::string::~string(local_190);
    std::__cxx11::string::~string(local_1f0);
    std::__cxx11::string::~string(local_210);
    std::__cxx11::string::~string(local_1b0);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string(local_90);
  }
  else {
    in_stack_fffffffffffffae7 =
         Lib::VirtualIterator<Kernel::Unit_*>::hasNext((VirtualIterator<Kernel::Unit_*> *)0x86dd6f);
    if ((bool)in_stack_fffffffffffffae7) {
      std::__cxx11::string::string(local_350);
      if (local_11 == SKOLEMIZE) {
        __s = &stack0xfffffffffffffc4f;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffae7,
                            CONCAT16(in_stack_fffffffffffffae6,in_stack_fffffffffffffae0)),__s,
                   (allocator<char> *)in_stack_fffffffffffffad0);
        getNewSymbols(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68)
        ;
        std::operator+((char *)in_stack_fffffffffffffaa8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffaa0);
        std::__cxx11::string::operator=(local_350,(string *)&stack0xfffffffffffffc90);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffc90);
        std::__cxx11::string::~string(local_390);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffc50);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc4f);
      }
      tptpRuleName_abi_cxx11_(in_stack_fffffffffffffae8,in_stack_fffffffffffffae7);
      std::operator+((char *)in_stack_fffffffffffffaa8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffaa0);
      this_01 = local_3d8;
      std::__cxx11::string::operator=(local_70,this_01);
      std::__cxx11::string::~string(this_01);
      std::__cxx11::string::~string(local_3f8);
      std::operator+((char *)in_stack_fffffffffffffae8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffae7,
                              CONCAT16(in_stack_fffffffffffffae6,in_stack_fffffffffffffae0)));
      std::operator+(in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
      std::__cxx11::string::operator+=(local_70,local_418);
      std::__cxx11::string::~string(local_418);
      std::__cxx11::string::~string(local_438);
      local_439 = 1;
      while (bVar1 = Lib::VirtualIterator<Kernel::Unit_*>::hasNext
                               ((VirtualIterator<Kernel::Unit_*> *)0x86e2e2), bVar1) {
        local_448 = Lib::VirtualIterator<Kernel::Unit_*>::next
                              ((VirtualIterator<Kernel::Unit_*> *)0x86e302);
        if ((local_439 & 1) == 0) {
          std::__cxx11::string::operator+=(local_70,',');
        }
        tptpUnitId_abi_cxx11_
                  (in_stack_fffffffffffffae8,
                   (Unit *)CONCAT17(in_stack_fffffffffffffae7,
                                    CONCAT16(in_stack_fffffffffffffae6,in_stack_fffffffffffffae0)));
        std::__cxx11::string::operator+=(local_70,local_468);
        std::__cxx11::string::~string(local_468);
        local_439 = 0;
      }
      std::__cxx11::string::operator+=(local_70,"])");
      std::__cxx11::string::~string(local_350);
    }
    else {
      std::__cxx11::string::string(local_230);
      in_stack_fffffffffffffae6 =
           hasNewSymbols((TPTPProofPrinter *)
                         CONCAT17(in_stack_fffffffffffffae7,
                                  CONCAT16(in_stack_fffffffffffffae6,in_stack_fffffffffffffae0)),
                         in_stack_fffffffffffffad8);
      if ((bool)in_stack_fffffffffffffae6) {
        std::__cxx11::string::string(local_250);
        if ((((local_11 == FUNCTION_DEFINITION) || (local_11 == FOOL_ITE_DEFINITION)) ||
            (local_11 == FOOL_LET_DEFINITION)) ||
           ((local_11 == FOOL_FORMULA_DEFINITION || (local_11 == FOOL_MATCH_DEFINITION)))) {
          std::__cxx11::string::operator=(local_250,"definition");
        }
        else {
          std::__cxx11::string::operator=(local_250,"naming");
        }
        std::__cxx11::string::string(local_290,local_250);
        getNewSymbols(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68)
        ;
        std::__cxx11::string::operator=(local_230,local_270);
        std::__cxx11::string::~string(local_270);
        std::__cxx11::string::~string(local_290);
        std::__cxx11::string::~string(local_250);
      }
      tptpRuleName_abi_cxx11_(in_stack_fffffffffffffae8,in_stack_fffffffffffffae7);
      std::operator+((char *)in_stack_fffffffffffffaa8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffaa0);
      std::operator+(in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
      std::operator+(in_stack_fffffffffffffaa8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffaa0);
      std::operator+(in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
      std::__cxx11::string::operator=(local_70,local_2b0);
      std::__cxx11::string::~string(local_2b0);
      std::__cxx11::string::~string(local_2d0);
      std::__cxx11::string::~string(local_2f0);
      std::__cxx11::string::~string(local_310);
      std::__cxx11::string::~string(local_330);
      std::__cxx11::string::~string(local_230);
    }
  }
  poVar2 = *(ostream **)(in_RDI + 0x78);
  tptpUnitId_abi_cxx11_
            (in_stack_fffffffffffffae8,
             (Unit *)CONCAT17(in_stack_fffffffffffffae7,
                              CONCAT16(in_stack_fffffffffffffae6,in_stack_fffffffffffffae0)));
  std::__cxx11::string::string(local_4c8,local_50);
  std::__cxx11::string::string(local_4e8,local_70);
  Unit::inputType((Unit *)0x86e4d9);
  getFofString(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
               in_stack_fffffffffffffc90,in_stack_fffffffffffffc8f,in_stack_fffffffffffffcc0);
  poVar2 = std::operator<<(poVar2,(string *)&stack0xfffffffffffffb78);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb78);
  std::__cxx11::string::~string(local_4e8);
  std::__cxx11::string::~string(local_4c8);
  std::__cxx11::string::~string(local_4a8);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  local_30 = 0;
LAB_0086e5a4:
  Lib::VirtualIterator<Kernel::Unit_*>::~VirtualIterator
            ((VirtualIterator<Kernel::Unit_*> *)in_stack_fffffffffffffaa0);
  return;
}

Assistant:

void printStep(Unit* us)
  {
    InferenceRule rule = us->inference().rule();
    UnitIterator parents= us->getParents();

    switch(rule) {
    //case Inference::AVATAR_COMPONENT:
    //  printSplittingComponentIntroduction(us);
    //  return;
    case InferenceRule::GENERAL_SPLITTING_COMPONENT:
      printGeneralSplittingComponent(us);
      return;
    case InferenceRule::GENERAL_SPLITTING:
      printSplitting(us);
      return;
    default: ;
    }

    //get std::string representing the formula

    std::string formulaStr=getFormulaString(us);

    //get inference std::string

    std::string inferenceStr;
    if (rule==InferenceRule::INPUT) {
      std::string fileName;
      if (env.options->inputFile()=="") {
	      fileName="unknown";
      }
      else {
	      fileName="'"+env.options->inputFile()+"'";
      }
      std::string axiomName;
      if (!outputAxiomNames || !Parse::TPTP::findAxiomName(us, axiomName)) {
        // Giles' ucore extraction code parses labels from smtlib files, let's try printing these too
        if (!us->isClause() && us->getFormula()->hasLabel()) {
          axiomName = us->getFormula()->getLabel();
        } else {
	        axiomName="unknown";
        }
      }
      inferenceStr="file("+fileName+","+quoteAxiomName(axiomName)+")";
    }
    else if (!parents.hasNext()) {
      std::string newSymbolInfo;
      if (hasNewSymbols(us)) {
        std::string newSymbOrigin;
        if (rule == InferenceRule::FUNCTION_DEFINITION ||
          rule == InferenceRule::FOOL_ITE_DEFINITION || rule == InferenceRule::FOOL_LET_DEFINITION ||
          rule == InferenceRule::FOOL_FORMULA_DEFINITION || rule == InferenceRule::FOOL_MATCH_DEFINITION) {
          newSymbOrigin = "definition";
        } else {
          newSymbOrigin = "naming";
        }
	      newSymbolInfo = getNewSymbols(newSymbOrigin,us);
      }
      inferenceStr="introduced("+tptpRuleName(rule)+",["+newSymbolInfo+"])";
    }
    else {
      ASS(parents.hasNext());
      std::string statusStr;
      if (rule==InferenceRule::SKOLEMIZE) {
	      statusStr="status(esa),"+getNewSymbols("skolem",us);
      }

      inferenceStr="inference("+tptpRuleName(rule);

      inferenceStr+=",["+statusStr+"],[";
      bool first=true;
      while(parents.hasNext()) {
        Unit* prem=parents.next();
        if (!first) {
          inferenceStr+=',';
        }
        inferenceStr+=tptpUnitId(prem);
        first=false;
      }
      inferenceStr+="])";
    }

    out<<getFofString(tptpUnitId(us), formulaStr, inferenceStr, rule, us->inputType())<<endl;
  }